

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O1

FT_Error FT_Stream_Read(FT_Stream stream,FT_Byte *buffer,FT_ULong count)

{
  ulong uVar1;
  FT_Error FVar2;
  ulong __n;
  
  uVar1 = stream->pos;
  FVar2 = 0x55;
  __n = stream->size - uVar1;
  if (uVar1 <= stream->size && __n != 0) {
    if (stream->read == (FT_Stream_IoFunc)0x0) {
      if (count <= __n) {
        __n = count;
      }
      memcpy(buffer,stream->base + uVar1,__n);
    }
    else {
      __n = (*stream->read)(stream,uVar1,buffer,count);
    }
    stream->pos = uVar1 + __n;
    FVar2 = 0x55;
    if (count <= __n) {
      FVar2 = 0;
    }
  }
  return FVar2;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Stream_ReadAt( FT_Stream  stream,
                    FT_ULong   pos,
                    FT_Byte*   buffer,
                    FT_ULong   count )
  {
    FT_Error  error = FT_Err_Ok;
    FT_ULong  read_bytes;


    if ( pos >= stream->size )
    {
      FT_ERROR(( "FT_Stream_ReadAt:"
                 " invalid i/o; pos = 0x%lx, size = 0x%lx\n",
                 pos, stream->size ));

      return FT_THROW( Invalid_Stream_Operation );
    }

    if ( stream->read )
      read_bytes = stream->read( stream, pos, buffer, count );
    else
    {
      read_bytes = stream->size - pos;
      if ( read_bytes > count )
        read_bytes = count;

      FT_MEM_COPY( buffer, stream->base + pos, read_bytes );
    }

    stream->pos = pos + read_bytes;

    if ( read_bytes < count )
    {
      FT_ERROR(( "FT_Stream_ReadAt:"
                 " invalid read; expected %lu bytes, got %lu\n",
                 count, read_bytes ));

      error = FT_THROW( Invalid_Stream_Operation );
    }

    return error;
  }